

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_CREATE_ARROWS(effect_handler_context_t_conflict *context)

{
  loc grid;
  chunk_conflict *c;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  bool great;
  _Bool none_left;
  object *obj;
  object *arrows;
  _Bool local_41;
  object *local_40;
  object *local_38;
  object *local_30;
  
  local_41 = false;
  if (context->cmd == (command *)0x0) {
    _Var1 = get_item(&local_40,"Make arrows from which staff? ","You have no staff to use.",CMD_NULL
                     ,tval_is_staff,L'\x06');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar2 = cmd_get_item((command_conflict *)context->cmd,"tgtitem",&local_40,
                         "Make arrows from which staff? ","You have no staff to use.",tval_is_staff,
                         L'\x06');
    if (wVar2 != L'\0') {
      return false;
    }
  }
  wVar2 = local_40->kind->level;
  uVar3 = Rand_div(wVar2);
  if ((int)uVar3 < 0x19) {
    great = false;
  }
  else {
    uVar4 = Rand_div(wVar2);
    great = 0x31 < (int)uVar4;
  }
  _Var1 = object_is_carried(player,local_40);
  if (_Var1) {
    local_38 = gear_object_for_use(player,local_40,L'\x01',true,&local_41);
  }
  else {
    local_38 = floor_object_for_use(player,local_40,L'\x01',true,&local_41);
  }
  if (local_38->known != (object *)0x0) {
    object_delete((chunk *)player->cave,(chunk *)0x0,&local_38->known);
  }
  object_delete((chunk *)cave,(chunk *)player->cave,&local_38);
  c = cave;
  wVar2 = eff_level(player);
  local_30 = make_object((chunk *)c,wVar2,0x18 < (int)uVar3,great,false,(int32_t *)0x0,L'\x03');
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  drop_near((chunk *)cave,&local_30,L'\0',grid,true,true);
  return true;
}

Assistant:

bool effect_handler_CREATE_ARROWS(effect_handler_context_t *context)
{
	int lev;
	struct object *obj, *staff, *arrows;
	const char *q, *s;
	int itemmode = (USE_INVEN | USE_FLOOR);
	bool good = false, great = false;
	bool none_left = false;

	/* Get an item */
	q = "Make arrows from which staff? ";
	s = "You have no staff to use.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_is_staff, itemmode)) {
			return false;
		}
	} else if (!get_item(&obj, q, s, 0, tval_is_staff, itemmode)) {
		return false;
	}

	/* Extract the object "level" */
	lev = obj->kind->level;

	/* Roll for good */
	if (randint1(lev) > 25) {
		good = true;
		/* Roll for great */
		if (randint1(lev) > 50) {
			great = true;
		}
	}

	/* Destroy the staff */
	if (object_is_carried(player, obj)) {
		staff = gear_object_for_use(player, obj, 1, true, &none_left);
	} else {
		staff = floor_object_for_use(player, obj, 1, true, &none_left);
	}

	if (staff->known) {
		object_delete(player->cave, NULL, &staff->known);
	}
	object_delete(cave, player->cave, &staff);

	/* Make some arrows */
	arrows = make_object(cave, eff_level(player), good, great, false, NULL,
						 TV_ARROW);
	drop_near(cave, &arrows, 0, player->grid, true, true);

	return true;
}